

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QTextLayout::FormatRange>::copyAppend
          (QGenericArrayOps<QTextLayout::FormatRange> *this,FormatRange *b,FormatRange *e)

{
  FormatRange *this_00;
  ulong in_RDX;
  ulong in_RSI;
  FormatRange *in_RDI;
  FormatRange *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QTextLayout::FormatRange>::begin
                        ((QArrayDataPointer<QTextLayout::FormatRange> *)0x5e5bc7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QTextLayout::FormatRange::FormatRange(this_00,in_RDI);
      local_10 = local_10 + 0x18;
      *(long *)&(in_RDI->format).field_0x8 = *(long *)&(in_RDI->format).field_0x8 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }